

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transitions.hpp
# Opt level: O0

event_process_result __thiscall
afsm::transitions::
state_transition_table<afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::test::connection_fsm_def::transaction,unsigned_long>
::
transit_state<afsm::test::connection_fsm_def::transaction::extended_query,afsm::test::connection_fsm_def::transaction::idle,afsm::test::events::ready_for_query,afsm::actions::detail::guard_check<afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::test::connection_fsm_def::transaction::extended_query,afsm::test::events::ready_for_query,afsm::none>,afsm::actions::detail::action_invocation<afsm::test::transit_action,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::test::connection_fsm_def::transaction::extended_query,afsm::test::connection_fsm_def::transaction::idle>,afsm::transitions::detail::state_exit<afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<___est::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>>>
          (state_transition_table<afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::test::connection_fsm_def::transaction,unsigned_long>
           *this,__tuple_element_t<2UL,_tuple<state<starting,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_inner_state_machine<simple_query,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_inner_state_machine<extended_query,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_state<idle,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_state<tran_error,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_state<exiting,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>_>
                 *event)

{
  event_process_result eVar1;
  undefined1 local_36 [6];
  __tuple_element_t<3UL,_tuple<state<starting,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_inner_state_machine<simple_query,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_inner_state_machine<extended_query,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_state<idle,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_state<tran_error,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_state<exiting,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>_>
  *local_30;
  __tuple_element_t<3UL,_tuple<state<starting,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_inner_state_machine<simple_query,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_inner_state_machine<extended_query,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_state<idle,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_state<tran_error,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_state<exiting,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>_>
  *target;
  __tuple_element_t<2UL,_tuple<state<starting,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_inner_state_machine<simple_query,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_inner_state_machine<extended_query,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_state<idle,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_state<tran_error,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_state<exiting,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>_>
  *source;
  ready_for_query *event_local;
  state_transition_table<afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::test::connection_fsm_def::transaction,_unsigned_long>
  *this_local;
  
  source = event;
  event_local = (ready_for_query *)this;
  target = (__tuple_element_t<3UL,_tuple<state<starting,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_inner_state_machine<simple_query,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_inner_state_machine<extended_query,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_state<idle,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_state<tran_error,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_state<exiting,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>_>
            *)std::
              get<2ul,afsm::state<afsm::test::connection_fsm_def::transaction::starting,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::simple_query,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>,afsm::state<afsm::test::connection_fsm_def::transaction::idle,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>,afsm::state<afsm::test::connection_fsm_def::transaction::tran_error,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>,afsm::state<afsm::test::connection_fsm_def::transaction::exiting,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>>
                        ((tuple<afsm::state<afsm::test::connection_fsm_def::transaction::starting,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::simple_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::idle,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::tran_error,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::exiting,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
                          *)(this + 0x10));
  local_30 = std::
             get<3ul,afsm::state<afsm::test::connection_fsm_def::transaction::starting,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::simple_query,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>,afsm::state<afsm::test::connection_fsm_def::transaction::idle,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>,afsm::state<afsm::test::connection_fsm_def::transaction::tran_error,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>,afsm::state<afsm::test::connection_fsm_def::transaction::exiting,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>>
                       ((tuple<afsm::state<afsm::test::connection_fsm_def::transaction::starting,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::simple_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::idle,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::tran_error,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::exiting,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
                         *)(this + 0x10));
  eVar1 = transit_state_impl<afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>,afsm::state<afsm::test::connection_fsm_def::transaction::idle,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>,afsm::test::events::ready_for_query,afsm::actions::detail::guard_check<afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::test::connection_fsm_def::transaction::extended_query,afsm::test::events::ready_for_query,afsm::none>,afsm::actions::detail::action_invocation<afsm::test::transit_action___est::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>>>
                    (this,source,target,local_30,3,local_36);
  return eVar1;
}

Assistant:

actions::event_process_result
    transit_state(Event&& event, Guard guard, Action action, SourceExit exit,
            TargetEnter enter, SourceClear clear)
    {
        using source_index = ::psst::meta::index_of<SourceState, inner_states_def>;
        using target_index = ::psst::meta::index_of<TargetState, inner_states_def>;

        static_assert(source_index::found, "Failed to find source state index");
        static_assert(target_index::found, "Failed to find target state index");

        auto& source = ::std::get< source_index::value >(states_);
        auto& target = ::std::get< target_index::value >(states_);
        return transit_state_impl(
                ::std::forward<Event>(event), source, target,
                 guard, action, exit, enter, clear,
                 target_index::value,
                 typename def::traits::exception_safety<state_machine_definition_type>::type{});
    }